

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_layer2.c
# Opt level: O2

int oonf_layer2_validate_mac_lid
              (cfg_schema_entry *entry,char *section_name,char *value,autobuf *out)

{
  uint uVar1;
  int iVar2;
  oonf_layer2_neigh_key key;
  
  uVar1 = oonf_layer2_neigh_key_from_string(&key,value);
  iVar2 = 0;
  if (0xfffffffb < uVar1) {
    cfg_append_printable_line
              (out,&DAT_001046d8 + *(int *)(&DAT_001046d8 + (ulong)(uVar1 + 4) * 4),value,
               (entry->key).entry,section_name);
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int
oonf_layer2_validate_mac_lid(const struct cfg_schema_entry *entry,
    const char *section_name, const char *value, struct autobuf *out) {
  struct oonf_layer2_neigh_key key;
  int result;

  result = oonf_layer2_neigh_key_from_string(&key, value);
  switch (result) {
    case -1:
      cfg_append_printable_line(out,
          "Address '%s' for entry '%s' in section %s is too long",
          value, entry->key.entry, section_name);
      break;
    case -2:
      cfg_append_printable_line(out,
          "Link-id '%s' for entry '%s' in section %s is not hexadecimal or too long",
          value, entry->key.entry, section_name);
      break;
    case -3:
      cfg_append_printable_line(out,
          "Address '%s' for entry '%s' in section %s is not a valid address",
          value, entry->key.entry, section_name);
      break;
    case -4:
      cfg_append_printable_line(out,
          "Address '%s' for entry '%s' in section %s is not MAC48 or EUI64",
          value, entry->key.entry, section_name);
      break;
    default:
      return 0;
  }
  return -1;
}